

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

string * __thiscall
spirv_cross::CompilerGLSL::constant_op_expression_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,SPIRConstantOp *cop)

{
  int iVar1;
  uint32_t id;
  uint uVar2;
  uint uVar3;
  uint *puVar4;
  uint32_t *puVar5;
  bool bVar6;
  bool bVar7;
  BaseType BVar8;
  SPIRType *pSVar9;
  undefined8 uVar10;
  SPIRType *pSVar11;
  CompilerError *pCVar12;
  Op opcode;
  string *psVar13;
  char (*in_R9) [2];
  char *pcVar14;
  uint32_t uVar15;
  ulong uVar16;
  BaseType input_type;
  undefined4 local_204;
  string right_arg;
  string op;
  string cast_op1;
  string local_1a0;
  string left_arg;
  
  pSVar9 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,(cop->basetype).id);
  op._M_dataplus._M_p = (pointer)&op.field_2;
  op._M_string_length = 0;
  op.field_2._M_local_buf[0] = '\0';
  bVar6 = is_legacy(this);
  iVar1 = *(int *)&(cop->super_IVariant).field_0xc;
  if ((bVar6) &&
     (((iVar1 - 0x6dU < 0x40 && ((0x8000040012000019U >> ((ulong)(iVar1 - 0x6dU) & 0x3f) & 1) != 0))
      || ((iVar1 - 0xaeU < 0x15 && ((0x100015U >> (iVar1 - 0xaeU & 0x1f) & 1) != 0)))))) {
    pCVar12 = (CompilerError *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&left_arg,"Unsigned integers are not supported on legacy targets.",
               (allocator *)&right_arg);
    CompilerError::CompilerError(pCVar12,&left_arg);
    __cxa_throw(pCVar12,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
  }
  pcVar14 = "!=";
  switch(iVar1) {
  case 0x7e:
    goto LAB_00251ced;
  case 0x7f:
  case 0x81:
  case 0x83:
  case 0x85:
  case 0x88:
  case 0x8c:
  case 0x8d:
  case 0x8e:
  case 0x8f:
  case 0x90:
  case 0x91:
  case 0x92:
  case 0x93:
  case 0x94:
  case 0x95:
  case 0x96:
  case 0x97:
  case 0x98:
  case 0x99:
  case 0x9a:
  case 0x9b:
  case 0x9c:
  case 0x9d:
  case 0x9e:
  case 0x9f:
  case 0xa0:
  case 0xa1:
  case 0xa2:
  case 0xa3:
  case 0xb4:
  case 0xb5:
  case 0xb6:
  case 0xb7:
  case 0xb8:
  case 0xb9:
  case 0xba:
  case 0xbb:
  case 0xbc:
  case 0xbd:
  case 0xbe:
  case 0xbf:
  case 0xc0:
  case 0xc1:
switchD_00251aaa_caseD_7f:
    pCVar12 = (CompilerError *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&left_arg,"Unimplemented spec constant op.",(allocator *)&right_arg);
    CompilerError::CompilerError(pCVar12,&left_arg);
    __cxa_throw(pCVar12,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
  case 0x80:
    break;
  case 0x82:
    break;
  case 0x84:
    break;
  case 0x86:
  case 0x87:
    break;
  case 0x89:
  case 0x8b:
    break;
  case 0x8a:
    puVar5 = (cop->arguments).super_VectorView<unsigned_int>.ptr;
    uVar15 = *puVar5;
    id = puVar5[1];
    to_enclosed_expression_abi_cxx11_(&left_arg,this,uVar15,true);
    to_enclosed_expression_abi_cxx11_(&right_arg,this,id,true);
    to_enclosed_expression_abi_cxx11_(&cast_op1,this,uVar15,true);
    to_enclosed_expression_abi_cxx11_(&local_1a0,this,id,true);
    join<std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[4],char_const(&)[2],std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
              (__return_storage_ptr__,(spirv_cross *)&left_arg,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x383eb1,
               (char (*) [4])&right_arg,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3963a5,
               (char (*) [4])0x3965df,(char (*) [2])&cast_op1,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3842fe,
               (char (*) [4])&local_1a0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x37f234,
               (char (*) [2])__return_storage_ptr__);
    ::std::__cxx11::string::~string((string *)&local_1a0);
    ::std::__cxx11::string::~string((string *)&cast_op1);
    goto LAB_002521f5;
  case 0xa4:
  case 0xaa:
    break;
  case 0xa5:
  case 0xab:
    break;
  case 0xa6:
    break;
  case 0xa7:
    break;
  case 0xa8:
    goto LAB_00251ced;
  case 0xa9:
    if ((cop->arguments).super_VectorView<unsigned_int>.buffer_size < 3) {
      pCVar12 = (CompilerError *)__cxa_allocate_exception(0x10,"/","<","<=",">");
      ::std::__cxx11::string::string
                ((string *)&left_arg,"Not enough arguments to OpSpecConstantOp.",
                 (allocator *)&right_arg);
      CompilerError::CompilerError(pCVar12,&left_arg);
      __cxa_throw(pCVar12,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    puVar4 = (cop->arguments).super_VectorView<unsigned_int>.ptr;
    in_R9 = (char (*) [2])(ulong)*puVar4;
    bVar6 = to_trivial_mix_op(this,pSVar9,&op,puVar4[2],puVar4[1],*puVar4);
    if (!bVar6) {
      puVar5 = (cop->arguments).super_VectorView<unsigned_int>.ptr;
      to_ternary_expression_abi_cxx11_
                (__return_storage_ptr__,this,pSVar9,*puVar5,puVar5[1],puVar5[2]);
      goto LAB_0025220c;
    }
LAB_00251aec:
    opcode = *(Op *)&(cop->super_IVariant).field_0xc;
    bVar6 = false;
    local_204 = 0;
    uVar15 = 0;
    pcVar14 = *in_R9;
    bVar7 = false;
    if (opcode - OpUConvert < 2) goto LAB_00251d30;
    goto LAB_00251d46;
  case 0xac:
  case 0xad:
    break;
  case 0xae:
  case 0xaf:
    break;
  case 0xb0:
  case 0xb1:
    break;
  case 0xb2:
  case 0xb3:
    break;
  case 0xc2:
  case 0xc3:
    break;
  case 0xc4:
    break;
  case 0xc5:
    break;
  case 0xc6:
    break;
  case 199:
    break;
  case 200:
LAB_00251ced:
    uVar10 = ::std::__cxx11::string::assign((char *)&op);
    local_204 = (undefined4)CONCAT71((int7)((ulong)uVar10 >> 8),1);
    bVar7 = false;
    goto LAB_00251d30;
  default:
    if (iVar1 - 0x71U < 3) {
      type_to_glsl_constructor_abi_cxx11_(&left_arg,this,pSVar9);
      ::std::__cxx11::string::operator=((string *)&op,(string *)&left_arg);
      ::std::__cxx11::string::~string((string *)&left_arg);
      goto LAB_00251aec;
    }
    if (iVar1 != 0x4f) {
      if (iVar1 == 0x51) {
        puVar5 = (cop->arguments).super_VectorView<unsigned_int>.ptr;
        access_chain_internal_abi_cxx11_
                  (__return_storage_ptr__,this,*puVar5,puVar5 + 1,
                   (int)(cop->arguments).super_VectorView<unsigned_int>.buffer_size - 1,1,
                   (AccessChainMeta *)0x0);
        goto LAB_0025220c;
      }
      if (iVar1 == 0x52) {
        pCVar12 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&left_arg,"OpCompositeInsert spec constant op is not supported.",
                   (allocator *)&right_arg);
        CompilerError::CompilerError(pCVar12,&left_arg);
        __cxa_throw(pCVar12,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      goto switchD_00251aaa_caseD_7f;
    }
    type_to_glsl_constructor_abi_cxx11_(__return_storage_ptr__,this,pSVar9);
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    pSVar9 = Compiler::expression_type
                       (&this->super_Compiler,*(cop->arguments).super_VectorView<unsigned_int>.ptr);
    uVar2 = pSVar9->vecsize;
    to_enclosed_expression_abi_cxx11_
              (&left_arg,this,*(cop->arguments).super_VectorView<unsigned_int>.ptr,true);
    to_enclosed_expression_abi_cxx11_
              (&right_arg,this,(cop->arguments).super_VectorView<unsigned_int>.ptr[1],true);
    uVar16 = 2;
    while (uVar16 < (uint)(cop->arguments).super_VectorView<unsigned_int>.buffer_size) {
      uVar3 = (cop->arguments).super_VectorView<unsigned_int>.ptr[uVar16];
      if (uVar3 < uVar2) {
        ::std::operator+(&local_1a0,&left_arg,".");
        ::std::operator+(&cast_op1,&local_1a0,"xyzw"[uVar3]);
        ::std::__cxx11::string::append((string *)__return_storage_ptr__);
      }
      else {
        ::std::operator+(&local_1a0,&right_arg,".");
        ::std::operator+(&cast_op1,&local_1a0,"xyzw"[uVar3 - uVar2]);
        ::std::__cxx11::string::append((string *)__return_storage_ptr__);
      }
      ::std::__cxx11::string::~string((string *)&cast_op1);
      ::std::__cxx11::string::~string((string *)&local_1a0);
      uVar16 = uVar16 + 1;
      if (uVar16 < (uint)(cop->arguments).super_VectorView<unsigned_int>.buffer_size) {
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
    }
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
LAB_002521f5:
    ::std::__cxx11::string::~string((string *)&right_arg);
    goto LAB_002521ff;
  }
  ::std::__cxx11::string::assign((char *)&op);
  local_204 = 0;
  bVar7 = true;
LAB_00251d30:
  bVar6 = bVar7;
  pSVar11 = Compiler::expression_type
                      (&this->super_Compiler,*(cop->arguments).super_VectorView<unsigned_int>.ptr);
  uVar15 = pSVar11->width;
  opcode = *(Op *)&(cop->super_IVariant).field_0xc;
  in_R9 = (char (*) [2])pcVar14;
LAB_00251d46:
  bVar7 = opcode_is_sign_invariant(opcode);
  uVar2 = opcode - OpIEqual;
  if (uVar2 < 0x1a) {
    if ((0x1000154U >> (uVar2 & 0x1f) & 1) != 0) goto switchD_00251d9b_caseD_86;
    if ((0x20002a8U >> (uVar2 & 0x1f) & 1) != 0) goto switchD_00251d9b_caseD_87;
    if ((3U >> (uVar2 & 0x1f) & 1) == 0) goto code_r0x00251d8d;
    BVar8 = to_signed_basetype(uVar15);
  }
  else {
code_r0x00251d8d:
    switch(opcode) {
    case OpSDiv:
    case OpSMod:
switchD_00251d9b_caseD_87:
      BVar8 = to_signed_basetype(uVar15);
      break;
    case OpFDiv:
    case OpSRem:
switchD_00251d9b_caseD_88:
      BVar8 = *(BaseType *)&(pSVar9->super_IVariant).field_0xc;
      break;
    default:
      if (opcode != OpUConvert) {
        if ((opcode != OpSConvert) && (opcode != OpSNegate)) goto switchD_00251d9b_caseD_88;
        goto switchD_00251d9b_caseD_87;
      }
    case OpUDiv:
    case OpUMod:
switchD_00251d9b_caseD_86:
      BVar8 = to_unsigned_basetype(uVar15);
    }
  }
  input_type = BVar8;
  if (bVar6) {
    if ((cop->arguments).super_VectorView<unsigned_int>.buffer_size < 2) {
      pCVar12 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&left_arg,"Not enough arguments to OpSpecConstantOp.",
                 (allocator *)&right_arg);
      CompilerError::CompilerError(pCVar12,&left_arg);
      __cxa_throw(pCVar12,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    right_arg._M_dataplus._M_p = (pointer)&right_arg.field_2;
    right_arg._M_string_length = 0;
    right_arg.field_2._M_local_buf[0] = '\0';
    cast_op1._M_dataplus._M_p = (pointer)&cast_op1.field_2;
    cast_op1._M_string_length = 0;
    cast_op1.field_2._M_local_buf[0] = '\0';
    puVar5 = (cop->arguments).super_VectorView<unsigned_int>.ptr;
    binary_op_bitcast_helper
              ((SPIRType *)&left_arg,this,&right_arg,&cast_op1,&input_type,*puVar5,puVar5[1],bVar7);
    BVar8 = *(BaseType *)&(pSVar9->super_IVariant).field_0xc;
    if (BVar8 == Boolean || BVar8 == input_type) {
      join<char_const(&)[2],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
                (__return_storage_ptr__,(spirv_cross *)0x3965df,(char (*) [2])&right_arg,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x37fb8c,
                 (char (*) [2])&op,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x37fb8c,
                 (char (*) [2])&cast_op1,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x37f234,
                 (char (*) [2])__return_storage_ptr__);
    }
    else {
      left_arg._M_string_length._4_4_ = input_type;
      (*(this->super_Compiler)._vptr_Compiler[0x38])(__return_storage_ptr__,this,pSVar9);
      ::std::__cxx11::string::push_back((char)__return_storage_ptr__);
      join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&>
                (&local_1a0,(spirv_cross *)&right_arg,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x37fb8c,
                 (char (*) [2])&op,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x37fb8c,
                 (char (*) [2])&cast_op1,__return_storage_ptr__);
      psVar13 = __return_storage_ptr__;
      ::std::__cxx11::string::append((string *)__return_storage_ptr__);
      ::std::__cxx11::string::~string((string *)&local_1a0);
      ::std::__cxx11::string::push_back((char)__return_storage_ptr__);
      __return_storage_ptr__ = psVar13;
    }
    SPIRType::~SPIRType((SPIRType *)&left_arg);
    ::std::__cxx11::string::~string((string *)&cast_op1);
    psVar13 = &right_arg;
  }
  else {
    if ((char)local_204 == '\0') {
      if (*(int *)&(cop->super_IVariant).field_0xc - 0x71U < 2) {
        if ((cop->arguments).super_VectorView<unsigned_int>.buffer_size == 0) {
          pCVar12 = (CompilerError *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&left_arg,"Not enough arguments to OpSpecConstantOp.",
                     (allocator *)&right_arg);
          CompilerError::CompilerError(pCVar12,&left_arg);
          __cxa_throw(pCVar12,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
        pSVar11 = Compiler::expression_type
                            (&this->super_Compiler,
                             *(cop->arguments).super_VectorView<unsigned_int>.ptr);
        if ((pSVar11->width < pSVar9->width) &&
           (BVar8 != *(BaseType *)&(pSVar11->super_IVariant).field_0xc)) {
          SPIRType::SPIRType((SPIRType *)&left_arg,pSVar11);
          left_arg._M_string_length._4_4_ = BVar8;
          bitcast_glsl_abi_cxx11_
                    (&right_arg,this,(SPIRType *)&left_arg,
                     *(cop->arguments).super_VectorView<unsigned_int>.ptr);
          join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
                    (__return_storage_ptr__,(spirv_cross *)&op,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3965df,
                     (char (*) [2])&right_arg,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x37f234,
                     in_R9);
          ::std::__cxx11::string::~string((string *)&right_arg);
          SPIRType::~SPIRType((SPIRType *)&left_arg);
          goto LAB_0025220c;
        }
        to_expression_abi_cxx11_
                  (&left_arg,this,*(cop->arguments).super_VectorView<unsigned_int>.ptr,true);
        join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
                  (__return_storage_ptr__,(spirv_cross *)&op,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3965df,
                   (char (*) [2])&left_arg,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x37f234,
                   in_R9);
      }
      else {
        if ((cop->arguments).super_VectorView<unsigned_int>.buffer_size == 0) {
          pCVar12 = (CompilerError *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&left_arg,"Not enough arguments to OpSpecConstantOp.",
                     (allocator *)&right_arg);
          CompilerError::CompilerError(pCVar12,&left_arg);
          __cxa_throw(pCVar12,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
        to_expression_abi_cxx11_
                  (&left_arg,this,*(cop->arguments).super_VectorView<unsigned_int>.ptr,true);
        join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
                  (__return_storage_ptr__,(spirv_cross *)&op,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3965df,
                   (char (*) [2])&left_arg,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x37f234,
                   in_R9);
      }
    }
    else {
      if ((cop->arguments).super_VectorView<unsigned_int>.buffer_size == 0) {
        pCVar12 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&left_arg,"Not enough arguments to OpSpecConstantOp.",
                   (allocator *)&right_arg);
        CompilerError::CompilerError(pCVar12,&left_arg);
        __cxa_throw(pCVar12,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      bitcast_glsl_abi_cxx11_
                (&left_arg,this,pSVar9,*(cop->arguments).super_VectorView<unsigned_int>.ptr);
      join<char_const(&)[2],std::__cxx11::string&,std::__cxx11::string,char_const(&)[2]>
                (__return_storage_ptr__,(spirv_cross *)0x3965df,(char (*) [2])&op,&left_arg,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x37f234,in_R9
                );
    }
LAB_002521ff:
    psVar13 = &left_arg;
  }
  ::std::__cxx11::string::~string((string *)psVar13);
LAB_0025220c:
  ::std::__cxx11::string::~string((string *)&op);
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::constant_op_expression(const SPIRConstantOp &cop)
{
	auto &type = get<SPIRType>(cop.basetype);
	bool binary = false;
	bool unary = false;
	string op;

	if (is_legacy() && is_unsigned_opcode(cop.opcode))
		SPIRV_CROSS_THROW("Unsigned integers are not supported on legacy targets.");

	// TODO: Find a clean way to reuse emit_instruction.
	switch (cop.opcode)
	{
	case OpSConvert:
	case OpUConvert:
	case OpFConvert:
		op = type_to_glsl_constructor(type);
		break;

#define GLSL_BOP(opname, x) \
	case Op##opname:        \
		binary = true;      \
		op = x;             \
		break

#define GLSL_UOP(opname, x) \
	case Op##opname:        \
		unary = true;       \
		op = x;             \
		break

		GLSL_UOP(SNegate, "-");
		GLSL_UOP(Not, "~");
		GLSL_BOP(IAdd, "+");
		GLSL_BOP(ISub, "-");
		GLSL_BOP(IMul, "*");
		GLSL_BOP(SDiv, "/");
		GLSL_BOP(UDiv, "/");
		GLSL_BOP(UMod, "%");
		GLSL_BOP(SMod, "%");
		GLSL_BOP(ShiftRightLogical, ">>");
		GLSL_BOP(ShiftRightArithmetic, ">>");
		GLSL_BOP(ShiftLeftLogical, "<<");
		GLSL_BOP(BitwiseOr, "|");
		GLSL_BOP(BitwiseXor, "^");
		GLSL_BOP(BitwiseAnd, "&");
		GLSL_BOP(LogicalOr, "||");
		GLSL_BOP(LogicalAnd, "&&");
		GLSL_UOP(LogicalNot, "!");
		GLSL_BOP(LogicalEqual, "==");
		GLSL_BOP(LogicalNotEqual, "!=");
		GLSL_BOP(IEqual, "==");
		GLSL_BOP(INotEqual, "!=");
		GLSL_BOP(ULessThan, "<");
		GLSL_BOP(SLessThan, "<");
		GLSL_BOP(ULessThanEqual, "<=");
		GLSL_BOP(SLessThanEqual, "<=");
		GLSL_BOP(UGreaterThan, ">");
		GLSL_BOP(SGreaterThan, ">");
		GLSL_BOP(UGreaterThanEqual, ">=");
		GLSL_BOP(SGreaterThanEqual, ">=");

	case OpSRem:
	{
		uint32_t op0 = cop.arguments[0];
		uint32_t op1 = cop.arguments[1];
		return join(to_enclosed_expression(op0), " - ", to_enclosed_expression(op1), " * ", "(",
		                 to_enclosed_expression(op0), " / ", to_enclosed_expression(op1), ")");
	}

	case OpSelect:
	{
		if (cop.arguments.size() < 3)
			SPIRV_CROSS_THROW("Not enough arguments to OpSpecConstantOp.");

		// This one is pretty annoying. It's triggered from
		// uint(bool), int(bool) from spec constants.
		// In order to preserve its compile-time constness in Vulkan GLSL,
		// we need to reduce the OpSelect expression back to this simplified model.
		// If we cannot, fail.
		if (to_trivial_mix_op(type, op, cop.arguments[2], cop.arguments[1], cop.arguments[0]))
		{
			// Implement as a simple cast down below.
		}
		else
		{
			// Implement a ternary and pray the compiler understands it :)
			return to_ternary_expression(type, cop.arguments[0], cop.arguments[1], cop.arguments[2]);
		}
		break;
	}

	case OpVectorShuffle:
	{
		string expr = type_to_glsl_constructor(type);
		expr += "(";

		uint32_t left_components = expression_type(cop.arguments[0]).vecsize;
		string left_arg = to_enclosed_expression(cop.arguments[0]);
		string right_arg = to_enclosed_expression(cop.arguments[1]);

		for (uint32_t i = 2; i < uint32_t(cop.arguments.size()); i++)
		{
			uint32_t index = cop.arguments[i];
			if (index >= left_components)
				expr += right_arg + "." + "xyzw"[index - left_components];
			else
				expr += left_arg + "." + "xyzw"[index];

			if (i + 1 < uint32_t(cop.arguments.size()))
				expr += ", ";
		}

		expr += ")";
		return expr;
	}

	case OpCompositeExtract:
	{
		auto expr = access_chain_internal(cop.arguments[0], &cop.arguments[1], uint32_t(cop.arguments.size() - 1),
		                                  ACCESS_CHAIN_INDEX_IS_LITERAL_BIT, nullptr);
		return expr;
	}

	case OpCompositeInsert:
		SPIRV_CROSS_THROW("OpCompositeInsert spec constant op is not supported.");

	default:
		// Some opcodes are unimplemented here, these are currently not possible to test from glslang.
		SPIRV_CROSS_THROW("Unimplemented spec constant op.");
	}

	uint32_t bit_width = 0;
	if (unary || binary || cop.opcode == OpSConvert || cop.opcode == OpUConvert)
		bit_width = expression_type(cop.arguments[0]).width;

	SPIRType::BaseType input_type;
	bool skip_cast_if_equal_type = opcode_is_sign_invariant(cop.opcode);

	switch (cop.opcode)
	{
	case OpIEqual:
	case OpINotEqual:
		input_type = to_signed_basetype(bit_width);
		break;

	case OpSLessThan:
	case OpSLessThanEqual:
	case OpSGreaterThan:
	case OpSGreaterThanEqual:
	case OpSMod:
	case OpSDiv:
	case OpShiftRightArithmetic:
	case OpSConvert:
	case OpSNegate:
		input_type = to_signed_basetype(bit_width);
		break;

	case OpULessThan:
	case OpULessThanEqual:
	case OpUGreaterThan:
	case OpUGreaterThanEqual:
	case OpUMod:
	case OpUDiv:
	case OpShiftRightLogical:
	case OpUConvert:
		input_type = to_unsigned_basetype(bit_width);
		break;

	default:
		input_type = type.basetype;
		break;
	}

#undef GLSL_BOP
#undef GLSL_UOP
	if (binary)
	{
		if (cop.arguments.size() < 2)
			SPIRV_CROSS_THROW("Not enough arguments to OpSpecConstantOp.");

		string cast_op0;
		string cast_op1;
		auto expected_type = binary_op_bitcast_helper(cast_op0, cast_op1, input_type, cop.arguments[0],
		                                              cop.arguments[1], skip_cast_if_equal_type);

		if (type.basetype != input_type && type.basetype != SPIRType::Boolean)
		{
			expected_type.basetype = input_type;
			auto expr = bitcast_glsl_op(type, expected_type);
			expr += '(';
			expr += join(cast_op0, " ", op, " ", cast_op1);
			expr += ')';
			return expr;
		}
		else
			return join("(", cast_op0, " ", op, " ", cast_op1, ")");
	}
	else if (unary)
	{
		if (cop.arguments.size() < 1)
			SPIRV_CROSS_THROW("Not enough arguments to OpSpecConstantOp.");

		// Auto-bitcast to result type as needed.
		// Works around various casting scenarios in glslang as there is no OpBitcast for specialization constants.
		return join("(", op, bitcast_glsl(type, cop.arguments[0]), ")");
	}
	else if (cop.opcode == OpSConvert || cop.opcode == OpUConvert)
	{
		if (cop.arguments.size() < 1)
			SPIRV_CROSS_THROW("Not enough arguments to OpSpecConstantOp.");

		auto &arg_type = expression_type(cop.arguments[0]);
		if (arg_type.width < type.width && input_type != arg_type.basetype)
		{
			auto expected = arg_type;
			expected.basetype = input_type;
			return join(op, "(", bitcast_glsl(expected, cop.arguments[0]), ")");
		}
		else
			return join(op, "(", to_expression(cop.arguments[0]), ")");
	}
	else
	{
		if (cop.arguments.size() < 1)
			SPIRV_CROSS_THROW("Not enough arguments to OpSpecConstantOp.");
		return join(op, "(", to_expression(cop.arguments[0]), ")");
	}
}